

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O3

void google::protobuf::compiler::php::anon_unknown_2::AnalyzeDependencyForFile
               (FileDescriptor *file,
               set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
               *nodes_without_dependency,
               map<const_google::protobuf::FileDescriptor_*,_std::set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<std::pair<const_google::protobuf::FileDescriptor_*const,_std::set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>_>_>_>
               *deps,map<const_google::protobuf::FileDescriptor_*,_int,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<std::pair<const_google::protobuf::FileDescriptor_*const,_int>_>_>
                     *dependency_count)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_header *p_Var2;
  size_t sVar3;
  int iVar4;
  FileDescriptor *pFVar5;
  mapped_type *pmVar6;
  _Base_ptr p_Var7;
  _Rb_tree<const_google::protobuf::FileDescriptor_*,_const_google::protobuf::FileDescriptor_*,_std::_Identity<const_google::protobuf::FileDescriptor_*>,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  *this;
  _Rb_tree<google::protobuf::FileDescriptor_const*,google::protobuf::FileDescriptor_const*,std::_Identity<google::protobuf::FileDescriptor_const*>,std::less<google::protobuf::FileDescriptor_const*>,std::allocator<google::protobuf::FileDescriptor_const*>>
  *this_00;
  _Base_ptr p_Var8;
  int iVar9;
  int iVar10;
  FileDescriptor *dependency;
  FileDescriptor *local_88;
  FileDescriptor *local_80;
  _Rb_tree<google::protobuf::FileDescriptor_const*,google::protobuf::FileDescriptor_const*,std::_Identity<google::protobuf::FileDescriptor_const*>,std::less<google::protobuf::FileDescriptor_const*>,std::allocator<google::protobuf::FileDescriptor_const*>>
  *local_78;
  map<const_google::protobuf::FileDescriptor_*,_int,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<std::pair<const_google::protobuf::FileDescriptor_*const,_int>_>_>
  *local_70;
  _Rb_tree<const_google::protobuf::FileDescriptor_*,_const_google::protobuf::FileDescriptor_*,_std::_Identity<const_google::protobuf::FileDescriptor_*>,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  local_68;
  
  iVar10 = *(int *)(file + 0x20);
  local_88 = file;
  local_78 = (_Rb_tree<google::protobuf::FileDescriptor_const*,google::protobuf::FileDescriptor_const*,std::_Identity<google::protobuf::FileDescriptor_const*>,std::less<google::protobuf::FileDescriptor_const*>,std::allocator<google::protobuf::FileDescriptor_const*>>
              *)nodes_without_dependency;
  local_70 = dependency_count;
  if (0 < iVar10) {
    iVar9 = 0;
    do {
      pFVar5 = FileDescriptor::dependency(file,iVar9);
      sVar3 = (*(undefined8 **)pFVar5)[1];
      if ((sVar3 == kDescriptorFile_abi_cxx11_._M_string_length) &&
         ((sVar3 == 0 ||
          (iVar4 = bcmp((void *)**(undefined8 **)pFVar5,kDescriptorFile_abi_cxx11_._M_dataplus._M_p,
                        sVar3), iVar4 == 0)))) {
        iVar10 = iVar10 + -1;
        break;
      }
      iVar9 = iVar9 + 1;
    } while (iVar9 < *(int *)(file + 0x20));
  }
  if (iVar10 == 0) {
    std::
    _Rb_tree<google::protobuf::FileDescriptor_const*,google::protobuf::FileDescriptor_const*,std::_Identity<google::protobuf::FileDescriptor_const*>,std::less<google::protobuf::FileDescriptor_const*>,std::allocator<google::protobuf::FileDescriptor_const*>>
    ::_M_insert_unique<google::protobuf::FileDescriptor_const*const&>(local_78,&local_88);
  }
  else {
    pmVar6 = std::
             map<const_google::protobuf::FileDescriptor_*,_int,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<std::pair<const_google::protobuf::FileDescriptor_*const,_int>_>_>
             ::operator[](local_70,&local_88);
    *pmVar6 = iVar10;
    if (0 < *(int *)(local_88 + 0x20)) {
      p_Var1 = &(deps->_M_t)._M_impl.super__Rb_tree_header;
      p_Var2 = &local_68._M_impl.super__Rb_tree_header;
      iVar10 = 0;
      do {
        pFVar5 = FileDescriptor::dependency(local_88,iVar10);
        sVar3 = (*(undefined8 **)pFVar5)[1];
        local_80 = pFVar5;
        if ((sVar3 != kDescriptorFile_abi_cxx11_._M_string_length) ||
           ((sVar3 != 0 &&
            (iVar9 = bcmp((void *)**(undefined8 **)pFVar5,
                          kDescriptorFile_abi_cxx11_._M_dataplus._M_p,sVar3), iVar9 != 0)))) {
          p_Var7 = (deps->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
          p_Var8 = &p_Var1->_M_header;
          if (p_Var7 == (_Base_ptr)0x0) {
LAB_00279ed7:
            local_68._M_impl._0_8_ = 0;
            local_68._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
            local_68._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
            local_68._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
            local_68._M_impl.super__Rb_tree_header._M_node_count = 0;
            local_68._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
            local_68._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
            this = &std::
                    map<const_google::protobuf::FileDescriptor_*,_std::set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<std::pair<const_google::protobuf::FileDescriptor_*const,_std::set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>_>_>_>
                    ::operator[](deps,&local_80)->_M_t;
            std::
            _Rb_tree<const_google::protobuf::FileDescriptor_*,_const_google::protobuf::FileDescriptor_*,_std::_Identity<const_google::protobuf::FileDescriptor_*>,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
            ::clear(this);
            if (local_68._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
              (this->_M_impl).super__Rb_tree_header._M_header._M_color =
                   local_68._M_impl.super__Rb_tree_header._M_header._M_color;
              (this->_M_impl).super__Rb_tree_header._M_header._M_parent =
                   local_68._M_impl.super__Rb_tree_header._M_header._M_parent;
              (this->_M_impl).super__Rb_tree_header._M_header._M_left =
                   local_68._M_impl.super__Rb_tree_header._M_header._M_left;
              (this->_M_impl).super__Rb_tree_header._M_header._M_right =
                   local_68._M_impl.super__Rb_tree_header._M_header._M_right;
              (local_68._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
                   &(this->_M_impl).super__Rb_tree_header._M_header;
              (this->_M_impl).super__Rb_tree_header._M_node_count =
                   local_68._M_impl.super__Rb_tree_header._M_node_count;
              local_68._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
              local_68._M_impl.super__Rb_tree_header._M_node_count = 0;
              local_68._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
              local_68._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
            }
            std::
            _Rb_tree<const_google::protobuf::FileDescriptor_*,_const_google::protobuf::FileDescriptor_*,_std::_Identity<const_google::protobuf::FileDescriptor_*>,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
            ::~_Rb_tree(&local_68);
          }
          else {
            do {
              if (*(FileDescriptor **)(p_Var7 + 1) >= pFVar5) {
                p_Var8 = p_Var7;
              }
              p_Var7 = (&p_Var7->_M_left)[*(FileDescriptor **)(p_Var7 + 1) < pFVar5];
            } while (p_Var7 != (_Base_ptr)0x0);
            if (((_Rb_tree_header *)p_Var8 == p_Var1) ||
               (pFVar5 < (FileDescriptor *)((_Rb_tree_header *)p_Var8)->_M_node_count))
            goto LAB_00279ed7;
          }
          this_00 = (_Rb_tree<google::protobuf::FileDescriptor_const*,google::protobuf::FileDescriptor_const*,std::_Identity<google::protobuf::FileDescriptor_const*>,std::less<google::protobuf::FileDescriptor_const*>,std::allocator<google::protobuf::FileDescriptor_const*>>
                     *)std::
                       map<const_google::protobuf::FileDescriptor_*,_std::set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<std::pair<const_google::protobuf::FileDescriptor_*const,_std::set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>_>_>_>
                       ::operator[](deps,&local_80);
          std::
          _Rb_tree<google::protobuf::FileDescriptor_const*,google::protobuf::FileDescriptor_const*,std::_Identity<google::protobuf::FileDescriptor_const*>,std::less<google::protobuf::FileDescriptor_const*>,std::allocator<google::protobuf::FileDescriptor_const*>>
          ::_M_insert_unique<google::protobuf::FileDescriptor_const*const&>(this_00,&local_88);
          AnalyzeDependencyForFile
                    (local_80,(set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                               *)local_78,deps,local_70);
        }
        iVar10 = iVar10 + 1;
      } while (iVar10 < *(int *)(local_88 + 0x20));
    }
  }
  return;
}

Assistant:

static void AnalyzeDependencyForFile(
    const FileDescriptor* file,
    std::set<const FileDescriptor*>* nodes_without_dependency,
    std::map<const FileDescriptor*, std::set<const FileDescriptor*>>* deps,
    std::map<const FileDescriptor*, int>* dependency_count) {
  int count = file->dependency_count();
  for (int i = 0; i < file->dependency_count(); i++) {
      const FileDescriptor* dependency = file->dependency(i);
      if (dependency->name() == kDescriptorFile) {
        count--;
        break;
      }
  }

  if (count == 0) {
    nodes_without_dependency->insert(file);
  } else {
    (*dependency_count)[file] = count;
    for (int i = 0; i < file->dependency_count(); i++) {
      const FileDescriptor* dependency = file->dependency(i);
      if (dependency->name() == kDescriptorFile) {
        continue;
      }
      if (deps->find(dependency) == deps->end()) {
        (*deps)[dependency] = std::set<const FileDescriptor*>();
      }
      (*deps)[dependency].insert(file);
      AnalyzeDependencyForFile(
          dependency, nodes_without_dependency, deps, dependency_count);
    }
  }
}